

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O0

void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  Fxu_Double *pDiv_local;
  Fxu_HeapDouble *p_local;
  
  if ((0 < pDiv->HNum) && (pDiv->HNum <= p->nItemsAlloc)) {
    if ((pDiv->HNum < 2) || (pDiv->Weight <= p->pTree[pDiv->HNum >> 1]->Weight)) {
      if ((p->nItems < pDiv->HNum * 2) || (p->pTree[pDiv->HNum << 1]->Weight <= pDiv->Weight)) {
        if ((pDiv->HNum * 2 + 1 <= p->nItems) &&
           (pDiv->Weight < p->pTree[pDiv->HNum * 2 + 1]->Weight)) {
          Fxu_HeapDoubleMoveDn(p,pDiv);
        }
      }
      else {
        Fxu_HeapDoubleMoveDn(p,pDiv);
      }
    }
    else {
      Fxu_HeapDoubleMoveUp(p,pDiv);
    }
    return;
  }
  __assert_fail("(pDiv)->HNum >= 1 && (pDiv)->HNum <= p->nItemsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                ,0xe3,"void Fxu_HeapDoubleUpdate(Fxu_HeapDouble *, Fxu_Double *)");
}

Assistant:

void Fxu_HeapDoubleUpdate( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
//printf( "Updating divisor %d.\n", pDiv->Num );

    FXU_HEAP_DOUBLE_ASSERT(p,pDiv);
    if ( FXU_HEAP_DOUBLE_PARENT_EXISTS(p,pDiv) && 
         FXU_HEAP_DOUBLE_WEIGHT(pDiv) > FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_PARENT(p,pDiv) ) )
        Fxu_HeapDoubleMoveUp( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD1_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD1(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
    else if ( FXU_HEAP_DOUBLE_CHILD2_EXISTS(p,pDiv) && 
        FXU_HEAP_DOUBLE_WEIGHT(pDiv) < FXU_HEAP_DOUBLE_WEIGHT( FXU_HEAP_DOUBLE_CHILD2(p,pDiv) ) )
        Fxu_HeapDoubleMoveDn( p, pDiv );
}